

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O2

ON_BoundingBox * __thiscall
ON_Sphere::BoundingBox(ON_BoundingBox *__return_storage_ptr__,ON_Sphere *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  
  ON_BoundingBox::ON_BoundingBox(__return_storage_ptr__);
  dVar1 = this->radius;
  (__return_storage_ptr__->m_min).z = (this->plane).origin.z;
  dVar4 = (this->plane).origin.y;
  (__return_storage_ptr__->m_min).x = (this->plane).origin.x;
  (__return_storage_ptr__->m_min).y = dVar4;
  dVar4 = (this->plane).origin.y;
  (__return_storage_ptr__->m_max).x = (this->plane).origin.x;
  (__return_storage_ptr__->m_max).y = dVar4;
  (__return_storage_ptr__->m_max).z = (this->plane).origin.z;
  dVar4 = (__return_storage_ptr__->m_min).x - dVar1;
  dVar5 = (__return_storage_ptr__->m_min).y - dVar1;
  auVar2._8_4_ = SUB84(dVar5,0);
  auVar2._0_8_ = dVar4;
  auVar2._12_4_ = (int)((ulong)dVar5 >> 0x20);
  (__return_storage_ptr__->m_min).x = dVar4;
  (__return_storage_ptr__->m_min).y = (double)auVar2._8_8_;
  (__return_storage_ptr__->m_min).z = (__return_storage_ptr__->m_min).z - dVar1;
  dVar4 = (__return_storage_ptr__->m_max).x + dVar1;
  dVar5 = (__return_storage_ptr__->m_max).y + dVar1;
  auVar3._8_4_ = SUB84(dVar5,0);
  auVar3._0_8_ = dVar4;
  auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
  (__return_storage_ptr__->m_max).x = dVar4;
  (__return_storage_ptr__->m_max).y = (double)auVar3._8_8_;
  (__return_storage_ptr__->m_max).z = dVar1 + (__return_storage_ptr__->m_max).z;
  return __return_storage_ptr__;
}

Assistant:

ON_BoundingBox ON_Sphere::BoundingBox() const
{
  ON_BoundingBox bbox;
  double r = Radius();
  bbox.m_min = Center();
  bbox.m_max = bbox.m_min;
  bbox.m_min.x -= r;
  bbox.m_min.y -= r;
  bbox.m_min.z -= r;
  bbox.m_max.x += r;
  bbox.m_max.y += r;
  bbox.m_max.z += r;
  return bbox;
}